

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.cpp
# Opt level: O2

void __thiscall Entity::spawn(Entity *this)

{
  int type;
  PowerUp *this_00;
  PowerUp *local_20;
  
  type = this->powerup;
  if (-1 < type) {
    this_00 = (PowerUp *)operator_new(0x50);
    PowerUp::PowerUp(this_00,this->x,this->y,type);
    local_20 = this_00;
    std::__cxx11::list<Entity_*,_std::allocator<Entity_*>_>::push_back
              (&new_entities_abi_cxx11_,(value_type *)&local_20);
  }
  return;
}

Assistant:

void Entity::spawn(void)
{
   if (powerup >= 0) {
      PowerUp *p = new PowerUp(x, y, powerup);
      new_entities.push_back(p);
   }
}